

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool __thiscall kj::anon_unknown_59::InMemoryDirectory::exists(InMemoryDirectory *this,PathPtr path)

{
  int iVar1;
  size_t sVar2;
  Impl *pIVar3;
  String *pSVar4;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> *pOVar5;
  ReadableDirectory *pRVar6;
  PathPtr PVar7;
  StringPtr name;
  StringPtr name_00;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> *subdir;
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> _subdir1042;
  EntryImpl *entry;
  StringPtr local_60;
  undefined1 local_50 [16];
  EntryImpl *_entry1036;
  undefined1 local_38 [8];
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  InMemoryDirectory *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  this_local = (InMemoryDirectory *)path.parts.ptr;
  lock.ptr = (Impl *)this;
  sVar2 = PathPtr::size((PathPtr *)&this_local);
  if (sVar2 == 0) {
    path_local.parts.size_._7_1_ = 1;
  }
  else {
    sVar2 = PathPtr::size((PathPtr *)&this_local);
    if (sVar2 == 1) {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_38,
                 &this->impl);
      pIVar3 = Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                         ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                          local_38);
      pSVar4 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr(&local_60,pSVar4);
      name.content.size_ = (size_t)local_60.content.ptr;
      name.content.ptr = (char *)pIVar3;
      Impl::tryGetEntry((Impl *)local_50,name);
      local_50._8_8_ =
           _::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_const>
                     ((Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)
                      local_50);
      if ((EntryImpl *)local_50._8_8_ == (EntryImpl *)0x0) {
        path_local.parts.size_._7_1_ = false;
      }
      else {
        path_local.parts.size_._7_1_ =
             exists(this,(Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                         local_38,(EntryImpl *)local_50._8_8_);
      }
      _subdir1042.value.ptr._4_4_ = 1;
      Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_38);
    }
    else {
      pSVar4 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr((StringPtr *)&subdir,pSVar4);
      name_00.content.size_ = (size_t)subdir;
      name_00.content.ptr = (char *)this;
      tryGetParent((InMemoryDirectory *)local_a0,name_00);
      _::readMaybe<kj::ReadableDirectory_const,decltype(nullptr)>
                ((_ *)local_90,
                 (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)local_a0);
      Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>::~Maybe
                ((Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)local_a0);
      pOVar5 = _::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_90);
      if (pOVar5 == (Own<const_kj::ReadableDirectory,_std::nullptr_t> *)0x0) {
        path_local.parts.size_._7_1_ = 0;
      }
      else {
        pOVar5 = _::OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t>::operator*
                           ((OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> *)local_90);
        pRVar6 = Own<const_kj::ReadableDirectory,_std::nullptr_t>::operator->(pOVar5);
        sVar2 = PathPtr::size((PathPtr *)&this_local);
        PVar7 = PathPtr::slice((PathPtr *)&this_local,1,sVar2);
        iVar1 = (*(pRVar6->super_FsNode)._vptr_FsNode[8])(pRVar6,PVar7.parts.ptr,PVar7.parts.size_);
        path_local.parts.size_._7_1_ = (byte)iVar1 & 1;
      }
      _subdir1042.value.ptr._4_4_ = 1;
      _::OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t>::~OwnOwn
                ((OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> *)local_90);
    }
  }
  return (bool)(path_local.parts.size_._7_1_ & 1);
}

Assistant:

bool exists(PathPtr path) const override {
    if (path.size() == 0) {
      return true;
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        return exists(lock, entry);
      } else {
        return false;
      }
    } else {
      KJ_IF_SOME(subdir, tryGetParent(path[0])) {
        return subdir->exists(path.slice(1, path.size()));
      } else {
        return false;
      }
    }
  }